

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQuant.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkSwapVariables(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  void *pvVar4;
  void *pvVar5;
  undefined8 uVar6;
  long *plVar7;
  long lVar8;
  Abc_Ntk_t *pAVar9;
  ulong uVar10;
  Abc_Obj_t *pAVar11;
  Vec_Ptr_t *pVVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQuant.c"
                  ,0x126,"Abc_Ntk_t *Abc_NtkSwapVariables(Abc_Ntk_t *)");
  }
  iVar1 = pNtk->vPis->nSize;
  pAVar9 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
  if (1 < iVar1) {
    uVar10 = (ulong)(uint)(iVar1 / 2);
    uVar13 = 0;
    uVar14 = uVar10;
    do {
      uVar2 = pNtk->vPis->nSize;
      if (((long)(int)uVar2 <= (long)uVar13) || (uVar2 <= uVar14)) goto LAB_0028684a;
      ppvVar3 = pNtk->vPis->pArray;
      pvVar4 = ppvVar3[uVar13];
      pvVar5 = ppvVar3[uVar14];
      uVar6 = *(undefined8 *)((long)pvVar4 + 0x40);
      *(undefined8 *)((long)pvVar4 + 0x40) = *(undefined8 *)((long)pvVar5 + 0x40);
      *(undefined8 *)((long)pvVar5 + 0x40) = uVar6;
      uVar13 = uVar13 + 1;
      uVar14 = uVar14 + 1;
    } while (uVar10 != uVar13);
  }
  pVVar12 = pNtk->vObjs;
  if (0 < pVVar12->nSize) {
    lVar15 = 0;
    do {
      plVar7 = (long *)pVVar12->pArray[lVar15];
      if ((plVar7 != (long *)0x0) && (uVar2 = *(uint *)((long)plVar7 + 0x14), (uVar2 & 0xf) == 7)) {
        lVar8 = *(long *)(*(long *)(*plVar7 + 0x20) + 8);
        pAVar11 = Abc_AigAnd((Abc_Aig_t *)pAVar9->pManFunc,
                             (Abc_Obj_t *)
                             ((ulong)(uVar2 >> 10 & 1) ^
                             *(ulong *)(*(long *)(lVar8 + (long)*(int *)plVar7[4] * 8) + 0x40)),
                             (Abc_Obj_t *)
                             ((ulong)(uVar2 >> 0xb & 1) ^
                             *(ulong *)(*(long *)(lVar8 + (long)((int *)plVar7[4])[1] * 8) + 0x40)))
        ;
        plVar7[8] = (long)pAVar11;
        pVVar12 = pNtk->vObjs;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar12->nSize);
  }
  if ((0 < pNtk->vPos->nSize) && (0 < pAVar9->vPos->nSize)) {
    plVar7 = (long *)*pNtk->vPos->pArray;
    Abc_ObjAddFanin((Abc_Obj_t *)*pAVar9->vPos->pArray,
                    (Abc_Obj_t *)
                    ((ulong)(*(uint *)((long)plVar7 + 0x14) >> 10 & 1) ^
                    *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                                        (long)*(int *)plVar7[4] * 8) + 0x40)));
    return pAVar9;
  }
LAB_0028684a:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkSwapVariables( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pMiter, * pObj, * pObj0, * pObj1;
    int i, nVars = Abc_NtkPiNum(pNtk)/2;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the new network 
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // update the PIs
    for ( i = 0; i < nVars; i++ )
    {
        pObj0 = Abc_NtkPi( pNtk, i );
        pObj1 = Abc_NtkPi( pNtk, i+nVars );
        pMiter = pObj0->pCopy;
        pObj0->pCopy = pObj1->pCopy;
        pObj1->pCopy = pMiter;
    }
    // restrash
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // add the PO
    pMiter = Abc_ObjChild0Copy( Abc_NtkPo(pNtk,0) );
    Abc_ObjAddFanin( Abc_NtkPo(pNtkNew,0), pMiter );
    return pNtkNew;
}